

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.hpp
# Opt level: O0

anon_class_72_5_b506d461 * __thiscall
qclab::qgates::lambda_QGate1<std::complex<double>>
          (anon_class_72_5_b506d461 *__return_storage_ptr__,qgates *this,Op op,
          SquareMatrix<std::complex<double>_> *mat1,complex<double> *vector)

{
  complex<double> *pcVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  int64_t iVar7;
  complex<double> *pcVar8;
  undefined7 in_register_00000011;
  SquareMatrix<std::complex<double>_> *this_00;
  SquareMatrix<std::complex<double>_> *local_a8;
  anon_class_72_5_b506d461 f;
  complex<double> m22;
  complex<double> m21;
  complex<double> m12;
  complex<double> m11;
  complex<double> *vector_local;
  SquareMatrix<std::complex<double>_> *mat1_local;
  Op op_local;
  
  this_00 = (SquareMatrix<std::complex<double>_> *)CONCAT71(in_register_00000011,op);
  iVar7 = dense::SquareMatrix<std::complex<double>_>::size(this_00);
  if (iVar7 == 2) {
    dense::operateInPlace<qclab::dense::SquareMatrix<std::complex<double>>>((Op)this,this_00);
    pcVar8 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,0,0);
    pcVar1 = *(complex<double> **)pcVar8->_M_value;
    uVar2 = *(undefined8 *)(pcVar8->_M_value + 8);
    pcVar8 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,0,1);
    uVar3 = *(undefined8 *)pcVar8->_M_value;
    uVar4 = *(undefined8 *)(pcVar8->_M_value + 8);
    pcVar8 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,1,0);
    uVar5 = *(undefined8 *)pcVar8->_M_value;
    uVar6 = *(undefined8 *)(pcVar8->_M_value + 8);
    pcVar8 = dense::SquareMatrix<std::complex<double>_>::operator()(this_00,1,1);
    f.m21._M_value._8_8_ = *(undefined8 *)pcVar8->_M_value;
    f.m22._M_value._0_8_ = *(undefined8 *)(pcVar8->_M_value + 8);
    local_a8 = mat1;
    f.vector = pcVar1;
    f.m11._M_value._0_8_ = uVar2;
    f.m11._M_value._8_8_ = uVar3;
    f.m12._M_value._0_8_ = uVar4;
    f.m12._M_value._8_8_ = uVar5;
    f.m21._M_value._0_8_ = uVar6;
    f.m22._M_value._8_8_ = f.m21._M_value._8_8_;
    memcpy(__return_storage_ptr__,&local_a8,0x48);
    return __return_storage_ptr__;
  }
  __assert_fail("mat1.size() == 2",
                "/workspace/llm4binary/github/license_c_cmakelists/QuantumComputingLab[P]qclabpp/src/qgates/apply.hpp"
                ,0xd,
                "auto qclab::qgates::lambda_QGate1(Op, qclab::dense::SquareMatrix<T>, T *) [T = std::complex<double>]"
               );
}

Assistant:

auto lambda_QGate1( Op op , qclab::dense::SquareMatrix< T > mat1 ,
                      T* vector ) {
    assert( mat1.size() == 2 ) ;
    // operation
    qclab::dense::operateInPlace( op , mat1 ) ;
    const T m11 = mat1( 0 , 0 ) ; const T m12 = mat1( 0 , 1 ) ;
    const T m21 = mat1( 1 , 0 ) ; const T m22 = mat1( 1 , 1 ) ;
    // matvec
    auto f = [=] ( const uint64_t a , const uint64_t b ) {
      const T x1 = vector[a] ;
      const T x2 = vector[b] ;
      vector[a] = m11 * x1 + m12 * x2 ;
      vector[b] = m21 * x1 + m22 * x2 ;
    } ;
    return f ;
  }